

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void __thiscall
QtMWidgets::MessageBoxPrivate::MessageBoxPrivate
          (MessageBoxPrivate *this,QString *titl,QString *txt,MessageBox *parent,QWidget *w)

{
  this->q = parent;
  (this->buttonsMap).d.d =
       (QMapData<std::map<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole,_std::less<QAbstractButton_*>,_std::allocator<std::pair<QAbstractButton_*const,_QtMWidgets::MessageBox::ButtonRole>_>_>_>
        *)0x0;
  this->frame = (QFrame *)0x0;
  this->vbox = (QVBoxLayout *)0x0;
  this->hbox = (QHBoxLayout *)0x0;
  this->title = (MsgBoxTitle *)0x0;
  this->scrollArea = (ScrollArea *)0x0;
  this->textLabel = (TextLabel *)0x0;
  this->okButton = (MsgBoxButton *)0x0;
  (this->buttonSeparators).d.d = (Data *)0x0;
  (this->buttonSeparators).d.ptr = (QFrame **)0x0;
  (this->buttonSeparators).d.size = 0;
  this->clickedButton = (QAbstractButton *)0x0;
  (this->buttons).d.d = (Data *)0x0;
  (this->buttons).d.ptr = (QAbstractButton **)0x0;
  (this->buttons).d.size = 0;
  this->screenMargin = 6;
  this->window = w;
  this->h1 = (QFrame *)0x0;
  this->h2 = (QFrame *)0x0;
  init(this,(EVP_PKEY_CTX *)titl);
  return;
}

Assistant:

MessageBoxPrivate( const QString & titl,
		const QString & txt, MessageBox * parent, QWidget * w )
		:	q( parent )
		,	frame( 0 )
		,	vbox( 0 )
		,	hbox( 0 )
		,	title( 0 )
		,	scrollArea( 0 )
		,	textLabel( 0 )
		,	okButton( 0 )
		,	clickedButton( 0 )
		,	screenMargin( 6 )
		,	window( w )
		,	h1( 0 )
		,	h2( 0 )
	{
		init( titl, txt );
	}